

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

Integer ma_table_lookup_assoc(TableData data)

{
  Integer IVar1;
  TableEntryState *pTVar2;
  long lVar3;
  
  lVar3 = 0;
  for (pTVar2 = &ma_table->state;
      (IVar1 = -1, lVar3 < ma_table_capacity &&
      ((*pTVar2 != TES_Allocated || (IVar1 = lVar3, ((TableEntry *)(pTVar2 + -2))->data != data))));
      pTVar2 = pTVar2 + 4) {
    lVar3 = lVar3 + 1;
  }
  return IVar1;
}

Assistant:

public Integer ma_table_lookup_assoc(data)
    TableData    data;        /* to lookup */
{
    Integer    i;

    /* perform a linear search from the first table slot */
    for (i = 0; i < ma_table_capacity; i++)
        if ((ma_table[i].state == TES_Allocated) && (ma_table[i].data == data))
            /* success */
            return i;

    /* failure */
    return TABLE_HANDLE_NONE;
}